

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O2

void __thiscall
QGraphicsProxyWidgetPrivate::setWidget_helper
          (QGraphicsProxyWidgetPrivate *this,QWidget *newWidget,bool autoShow)

{
  QPointer<QWidget> *this_00;
  QGraphicsItem **ppQVar1;
  QGraphicsItem *pQVar2;
  Data *pDVar3;
  QWidgetPrivate *this_01;
  long lVar4;
  double dVar5;
  double dVar6;
  QMarginsF margins;
  bool bVar7;
  int iVar8;
  uint uVar9;
  LayoutDirection direction;
  QWidget *pQVar10;
  QWidget *pQVar11;
  QWExtra *pQVar12;
  QStyle *style;
  QSize QVar13;
  QGraphicsItem *pQVar14;
  QWidget *pQVar15;
  char *pcVar16;
  QObject *pQVar17;
  QGraphicsItem *this_02;
  QGraphicsItem **ppQVar18;
  long in_FS_OFFSET;
  QMargins QVar19;
  QObject local_a0 [8];
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  char *pcStack_60;
  QArrayDataPointer<QGraphicsItem_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->super_QGraphicsWidgetPrivate).super_QGraphicsItemPrivate.q_ptr;
  pDVar3 = (this->widget).wp.d;
  this_02 = pQVar2 + -1;
  if (pQVar2 == (QGraphicsItem *)0x0) {
    this_02 = (QGraphicsItem *)0x0;
  }
  if ((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) {
    pQVar10 = (QWidget *)0x0;
  }
  else {
    pQVar10 = (QWidget *)(this->widget).wp.value;
  }
  if (pQVar10 != newWidget) {
    this_00 = &this->widget;
    bVar7 = QPointer::operator_cast_to_bool((QPointer *)this_00);
    if (bVar7) {
      pDVar3 = (this_00->wp).d;
      if ((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) {
        pQVar17 = (QObject *)0x0;
      }
      else {
        pQVar17 = (this->widget).wp.value;
      }
      QObject::disconnect(pQVar17,"2destroyed()",(QObject *)this_02,"1_q_removeWidgetSlot()");
      QObject::removeEventFilter((this->widget).wp.value);
      QWidget::setAttribute((QWidget *)(this->widget).wp.value,WA_DontShowOnScreen,false);
      *(undefined8 *)(*(long *)(*(long *)((this->widget).wp.value + 8) + 0x78) + 0x10) = 0;
      (*(this->super_QGraphicsWidgetPrivate).super_QGraphicsItemPrivate._vptr_QGraphicsItemPrivate
        [5])(this,(ulong)(this->super_QGraphicsWidgetPrivate).inheritedFontResolveMask);
      (*(this->super_QGraphicsWidgetPrivate).super_QGraphicsItemPrivate._vptr_QGraphicsItemPrivate
        [6])(this,(ulong)(this->super_QGraphicsWidgetPrivate).inheritedPaletteResolveMask);
      QWidget::update((QWidget *)(this->widget).wp.value);
      pQVar2 = this_02 + 1;
      local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
      QGraphicsItem::childItems((QList<QGraphicsItem_*> *)&local_58,pQVar2);
      ppQVar1 = local_58.ptr + local_58.size;
      for (ppQVar18 = local_58.ptr; ppQVar18 != ppQVar1; ppQVar18 = ppQVar18 + 1) {
        pQVar14 = *ppQVar18;
        iVar8 = (*((pQVar14->d_ptr).d)->_vptr_QGraphicsItemPrivate[7])();
        if ((char)iVar8 != '\0') {
          pQVar14 = pQVar14 + -1;
          pQVar10 = QGraphicsProxyWidget::widget((QGraphicsProxyWidget *)pQVar14);
          pDVar3 = (this->widget).wp.d;
          do {
            pQVar11 = pQVar10;
            if ((pQVar11 == (QWidget *)0x0) ||
               (pQVar10 = *(QWidget **)(*(long *)&pQVar11->field_0x8 + 0x10),
               pQVar10 == (QWidget *)0x0)) break;
            if (pDVar3 == (Data *)0x0) {
              pQVar15 = (QWidget *)0x0;
            }
            else {
              pQVar15 = (QWidget *)(this->widget).wp.value;
              if (*(int *)(pDVar3 + 4) == 0) {
                pQVar15 = (QWidget *)0x0;
              }
            }
          } while (pQVar15 != pQVar11);
          pQVar10 = QGraphicsProxyWidget::widget((QGraphicsProxyWidget *)pQVar14);
          if (pQVar10 != (QWidget *)0x0) {
            pDVar3 = (this_00->wp).d;
            if ((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) {
              pQVar10 = (QWidget *)0x0;
            }
            else {
              pQVar10 = (QWidget *)(this->widget).wp.value;
            }
            if (pQVar10 == pQVar11) {
              QGraphicsProxyWidget::setWidget((QGraphicsProxyWidget *)pQVar14,(QWidget *)0x0);
              (*pQVar14->_vptr_QGraphicsItem[4])(pQVar14);
            }
          }
        }
      }
      QWeakPointer<QObject>::assign<QObject>(&this_00->wp,(QObject *)0x0);
      QGraphicsItem::unsetCursor(pQVar2);
      QGraphicsItem::setAcceptHoverEvents(pQVar2,false);
      if (newWidget == (QWidget *)0x0) {
        local_68 = 0;
        uStack_64 = 0;
        pcStack_60 = (char *)0x0;
        local_78.data = 0;
        uStack_74 = 0;
        uStack_70 = 0;
        uStack_6c = 0;
        QGraphicsItem::update(pQVar2,(QRectF *)&local_78.bits);
      }
      QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer(&local_58);
    }
    if (newWidget != (QWidget *)0x0) {
      this_01 = *(QWidgetPrivate **)&newWidget->field_0x8;
      if ((((newWidget->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
            super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) &&
         ((lVar4 = *(long *)(*(long *)(*(long *)&this_01->field_0x10 + 8) + 0x78), lVar4 == 0 ||
          (*(long *)(lVar4 + 0x10) == 0)))) {
        pcVar16 = 
        "QGraphicsProxyWidget::setWidget: cannot embed widget %p which is not a toplevel widget, and is not a child of an embedded widget"
        ;
      }
      else {
        pQVar12 = (this_01->extra)._M_t.
                  super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                  super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                  super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
        if (pQVar12 == (QWExtra *)0x0) {
          QWidgetPrivate::createExtra(this_01);
          pQVar12 = *(QWExtra **)(*(long *)&newWidget->field_0x8 + 0x78);
        }
        if ((QGraphicsItem *)pQVar12->proxyWidget == (QGraphicsItem *)0x0) {
          pQVar12->proxyWidget = (QGraphicsProxyWidget *)this_02;
          QWidget::setAttribute(newWidget,WA_DontShowOnScreen,true);
          QWidget::ensurePolished(newWidget);
          QWidget::setAttribute(newWidget,WA_QuitOnClose,false);
          pQVar2 = this_02 + 1;
          QGraphicsItem::setAcceptHoverEvents(pQVar2,true);
          uVar9 = newWidget->data->widget_attributes;
          if ((uVar9 >> 9 & 1) != 0) {
            QGraphicsWidget::setAttribute((QGraphicsWidget *)this_02,WA_NoSystemBackground,true);
            uVar9 = newWidget->data->widget_attributes;
          }
          if ((uVar9 & 0x10) != 0) {
            QGraphicsWidget::setAttribute((QGraphicsWidget *)this_02,WA_OpaquePaintEvent,true);
          }
          QWeakPointer<QObject>::assign<QObject>(&this_00->wp,&newWidget->super_QObject);
          this->field_0x244 = 0xaa;
          if (((autoShow) &&
              (bVar7 = QWidget::testAttribute_helper(newWidget,WA_WState_ExplicitShowHide), !bVar7))
             || ((newWidget->data->widget_attributes & 0x10000) == 0)) {
            QWidget::show(newWidget);
          }
          bVar7 = QWidget::testAttribute_helper(newWidget,WA_SetCursor);
          if (bVar7) {
            QWidget::cursor((QWidget *)&local_78.bits);
            QGraphicsItem::setCursor(pQVar2,(QCursor *)&local_78.bits);
            QCursor::~QCursor((QCursor *)&local_78.bits);
          }
          QGraphicsItem::setEnabled(pQVar2,(newWidget->data->widget_attributes & 1) == 0);
          QGraphicsItem::setVisible
                    (pQVar2,SUB21((ushort)(short)newWidget->data->widget_attributes >> 0xf,0));
          direction = QWidget::layoutDirection(newWidget);
          QGraphicsWidget::setLayoutDirection((QGraphicsWidget *)this_02,direction);
          bVar7 = QWidget::testAttribute_helper(newWidget,WA_SetStyle);
          if (bVar7) {
            style = QWidget::style((QWidget *)(this->widget).wp.value);
            QGraphicsWidget::setStyle((QGraphicsWidget *)this_02,style);
          }
          (*(this->super_QGraphicsWidgetPrivate).super_QGraphicsItemPrivate.
            _vptr_QGraphicsItemPrivate[5])
                    (this,(ulong)(this->super_QGraphicsWidgetPrivate).inheritedFontResolveMask);
          (*(this->super_QGraphicsWidgetPrivate).super_QGraphicsItemPrivate.
            _vptr_QGraphicsItemPrivate[6])
                    (this,(ulong)(this->super_QGraphicsWidgetPrivate).inheritedPaletteResolveMask);
          bVar7 = QWidget::testAttribute_helper(newWidget,WA_Resized);
          if (!bVar7) {
            QWidget::adjustSize(newWidget);
          }
          QVar19 = QWidget::contentsMargins(newWidget);
          local_98 = (double)QVar19.m_left.m_i.m_i;
          dStack_90 = (double)QVar19.m_top.m_i.m_i;
          local_88 = (double)QVar19.m_right.m_i.m_i;
          dStack_80 = (double)QVar19.m_bottom.m_i.m_i;
          margins.m_top = dStack_90;
          margins.m_left = local_98;
          margins.m_right = local_88;
          margins.m_bottom = dStack_80;
          QGraphicsWidget::setContentsMargins((QGraphicsWidget *)this_02,margins);
          QWidget::windowTitle((QString *)&local_78.bits,newWidget);
          QGraphicsWidget::setWindowTitle((QGraphicsWidget *)this_02,(QString *)&local_78.bits);
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&local_78.bits);
          pQVar2 = this_02 + 2;
          local_78.bits = (Bits)QWidget::sizePolicy(newWidget);
          QGraphicsLayoutItem::setSizePolicy
                    ((QGraphicsLayoutItem *)pQVar2,(QSizePolicy *)&local_78.bits);
          QVar13 = QWidget::minimumSize(newWidget);
          dVar5 = -1.0;
          dVar6 = dVar5;
          if ((ulong)QVar13 >> 0x20 != 0 || QVar13.wd.m_i.m_i != 0) {
            dVar5 = (double)QVar13.wd.m_i.m_i;
            dVar6 = (double)QVar13.ht.m_i.m_i;
          }
          local_78.data = SUB84(dVar5,0);
          uStack_74 = (undefined4)((ulong)dVar5 >> 0x20);
          uStack_70 = SUB84(dVar6,0);
          uStack_6c = (undefined4)((ulong)dVar6 >> 0x20);
          QGraphicsLayoutItem::setMinimumSize
                    ((QGraphicsLayoutItem *)pQVar2,(QSizeF *)&local_78.bits);
          QVar13 = QWidget::maximumSize(newWidget);
          dVar6 = -1.0;
          dVar5 = dVar6;
          if ((ulong)QVar13 >> 0x20 != 0 || QVar13.wd.m_i.m_i != 0) {
            dVar6 = (double)QVar13.wd.m_i.m_i;
            dVar5 = (double)QVar13.ht.m_i.m_i;
          }
          local_78.data = SUB84(dVar6,0);
          uStack_74 = (undefined4)((ulong)dVar6 >> 0x20);
          uStack_70 = SUB84(dVar5,0);
          uStack_6c = (undefined4)((ulong)dVar5 >> 0x20);
          QGraphicsLayoutItem::setMaximumSize
                    ((QGraphicsLayoutItem *)pQVar2,(QSizeF *)&local_78.bits);
          updateProxyGeometryFromWidget(this);
          updateProxyInputMethodAcceptanceFromWidget(this);
          QObject::installEventFilter(&newWidget->super_QObject);
          QObject::connect(local_a0,(char *)newWidget,(QObject *)"2destroyed()",(char *)this_02,
                           0x678b51);
          QMetaObject::Connection::~Connection((Connection *)local_a0);
          this->field_0x244 = 0;
          goto LAB_0058e756;
        }
        if ((QGraphicsItem *)pQVar12->proxyWidget == this_02) goto LAB_0058e756;
        pcVar16 = "QGraphicsProxyWidget::setWidget: cannot embed widget %p; already embedded";
      }
      pcStack_60 = "default";
      uStack_64 = 0;
      local_68 = 0;
      uStack_6c = 0;
      uStack_70 = 0;
      uStack_74 = 0;
      local_78.data = 2;
      QMessageLogger::warning((char *)&local_78.data,pcVar16,newWidget);
    }
  }
LAB_0058e756:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsProxyWidgetPrivate::setWidget_helper(QWidget *newWidget, bool autoShow)
{
    Q_Q(QGraphicsProxyWidget);
    if (newWidget == widget)
        return;
    if (widget) {
        QObject::disconnect(widget, SIGNAL(destroyed()), q, SLOT(_q_removeWidgetSlot()));
        widget->removeEventFilter(q);
        widget->setAttribute(Qt::WA_DontShowOnScreen, false);
        widget->d_func()->extra->proxyWidget = nullptr;
        resolveFont(inheritedFontResolveMask);
        resolvePalette(inheritedPaletteResolveMask);
        widget->update();

        const auto childItems = q->childItems();
        for (QGraphicsItem *child : childItems) {
            if (child->d_ptr->isProxyWidget()) {
                QGraphicsProxyWidget *childProxy = static_cast<QGraphicsProxyWidget *>(child);
                QWidget *parent = childProxy->widget();
                while (parent && parent->parentWidget()) {
                    if (parent == widget)
                        break;
                    parent = parent->parentWidget();
                }
                if (!childProxy->widget() || parent != widget)
                    continue;
                childProxy->setWidget(nullptr);
                delete childProxy;
            }
        }

        widget = nullptr;
#ifndef QT_NO_CURSOR
        q->unsetCursor();
#endif
        q->setAcceptHoverEvents(false);
        if (!newWidget)
            q->update();
    }
    if (!newWidget)
        return;
    if (!newWidget->isWindow()) {
        const auto &extra = newWidget->parentWidget()->d_func()->extra;
        if (!extra || !extra->proxyWidget)  {
            qWarning("QGraphicsProxyWidget::setWidget: cannot embed widget %p "
                     "which is not a toplevel widget, and is not a child of an embedded widget", newWidget);
            return;
        }
    }

    // Register this proxy within the widget's private.
    // ### This is a bit backdoorish
    QWExtra *extra = newWidget->d_func()->extra.get();
    if (!extra) {
        newWidget->d_func()->createExtra();
        extra = newWidget->d_func()->extra.get();
    }
    QGraphicsProxyWidget **proxyWidget = &extra->proxyWidget;
    if (*proxyWidget) {
        if (*proxyWidget != q) {
            qWarning("QGraphicsProxyWidget::setWidget: cannot embed widget %p"
                        "; already embedded", newWidget);
        }
        return;
    }
    *proxyWidget = q;

    newWidget->setAttribute(Qt::WA_DontShowOnScreen);
    newWidget->ensurePolished();
    // Do not wait for this widget to close before the app closes ###
    // shouldn't this widget inherit the attribute?
    newWidget->setAttribute(Qt::WA_QuitOnClose, false);
    q->setAcceptHoverEvents(true);

    if (newWidget->testAttribute(Qt::WA_NoSystemBackground))
        q->setAttribute(Qt::WA_NoSystemBackground);
    if (newWidget->testAttribute(Qt::WA_OpaquePaintEvent))
        q->setAttribute(Qt::WA_OpaquePaintEvent);

    widget = newWidget;

    // Changes only go from the widget to the proxy.
    enabledChangeMode = QGraphicsProxyWidgetPrivate::WidgetToProxyMode;
    visibleChangeMode = QGraphicsProxyWidgetPrivate::WidgetToProxyMode;
    posChangeMode = QGraphicsProxyWidgetPrivate::WidgetToProxyMode;
    sizeChangeMode = QGraphicsProxyWidgetPrivate::WidgetToProxyMode;

    if ((autoShow && !newWidget->testAttribute(Qt::WA_WState_ExplicitShowHide)) || !newWidget->testAttribute(Qt::WA_WState_Hidden)) {
        newWidget->show();
    }

    // Copy the state from the widget onto the proxy.
#ifndef QT_NO_CURSOR
    if (newWidget->testAttribute(Qt::WA_SetCursor))
        q->setCursor(widget->cursor());
#endif
    q->setEnabled(newWidget->isEnabled());
    q->setVisible(newWidget->isVisible());
    q->setLayoutDirection(newWidget->layoutDirection());
    if (newWidget->testAttribute(Qt::WA_SetStyle))
        q->setStyle(widget->style());

    resolveFont(inheritedFontResolveMask);
    resolvePalette(inheritedPaletteResolveMask);

    if (!newWidget->testAttribute(Qt::WA_Resized))
        newWidget->adjustSize();

    q->setContentsMargins(newWidget->contentsMargins());
    q->setWindowTitle(newWidget->windowTitle());

    // size policies and constraints..
    q->setSizePolicy(newWidget->sizePolicy());
    QSize sz = newWidget->minimumSize();
    q->setMinimumSize(sz.isNull() ? QSizeF() : QSizeF(sz));
    sz = newWidget->maximumSize();
    q->setMaximumSize(sz.isNull() ? QSizeF() : QSizeF(sz));

    updateProxyGeometryFromWidget();

    updateProxyInputMethodAcceptanceFromWidget();

    // Hook up the event filter to keep the state up to date.
    newWidget->installEventFilter(q);
    QObject::connect(newWidget, SIGNAL(destroyed()), q, SLOT(_q_removeWidgetSlot()));

    // Changes no longer go only from the widget to the proxy.
    enabledChangeMode = QGraphicsProxyWidgetPrivate::NoMode;
    visibleChangeMode = QGraphicsProxyWidgetPrivate::NoMode;
    posChangeMode = QGraphicsProxyWidgetPrivate::NoMode;
    sizeChangeMode = QGraphicsProxyWidgetPrivate::NoMode;
}